

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Label.cxx
# Opt level: O1

void multi_labeltype(Fl_Label *o,int x,int y,int w,int h,Fl_Align a)

{
  int iVar1;
  int H;
  int W;
  Fl_Label local;
  int local_78;
  int local_74;
  char *local_70;
  Fl_Label local_68;
  
  local_70 = o->value;
  local_68.image = o->image;
  local_68.deimage = o->deimage;
  local_68.font = o->font;
  local_68.size = o->size;
  local_68.color = o->color;
  local_68.align_ = o->align_;
  local_68.value = *(char **)local_70;
  local_68.type = local_70[0x10];
  local_68._41_7_ = SUB87((ulong)*(undefined8 *)&o->type >> 8,0);
  local_78 = h;
  local_74 = w;
  Fl_Label::measure(&local_68,&local_74,&local_78);
  Fl_Label::draw(&local_68,x,y,w,h,a);
  if ((a & 2) == 0) {
    if ((a & 1) == 0) {
      if ((a & 8) == 0) {
        if ((a & 4) == 0) {
          iVar1 = (local_78 + h) / 2;
          y = y + iVar1;
          h = h - iVar1;
        }
        else {
          x = x + local_74;
          w = w - local_74;
        }
      }
      else {
        w = w - local_74;
      }
    }
    else {
      y = y + local_78;
      h = h - local_78;
    }
  }
  else {
    h = h - local_78;
  }
  local_68.value = *(char **)(local_70 + 8);
  local_68.type = local_70[0x11];
  Fl_Label::draw(&local_68,x,y,w,h,a);
  return;
}

Assistant:

static void multi_labeltype(
    const Fl_Label* o, int x, int y, int w, int h, Fl_Align a)
{
  Fl_Multi_Label* b = (Fl_Multi_Label*)(o->value);
  Fl_Label local = *o;
  local.value = b->labela;
  local.type = b->typea;
  int W = w; int H = h; local.measure(W, H);
  local.draw(x,y,w,h,a);
  if (a & FL_ALIGN_BOTTOM) h -= H;
  else if (a & FL_ALIGN_TOP) {y += H; h -= H;}
  else if (a & FL_ALIGN_RIGHT) w -= W;
  else if (a & FL_ALIGN_LEFT) {x += W; w -= W;}
  else {int d = (h+H)/2; y += d; h -= d;}
  local.value = b->labelb;
  local.type = b->typeb;
  local.draw(x,y,w,h,a);
}